

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall HWISim::DigitalWrite(HWISim *this,Pin pin,PinState state)

{
  pointer pcVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  string name;
  PinState local_38;
  Pin local_34;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  local_38 = state;
  local_34 = pin;
  pmVar2 = std::__detail::
           _Map_base<HWI::Pin,_std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<HWI::Pin>,_EnumHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<HWI::Pin,_std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<HWI::Pin>,_EnumHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&HWI::pinNames_abi_cxx11_,&local_34);
  pcVar1 = (pmVar2->_M_dataplus)._M_p;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,pcVar1,pcVar1 + pmVar2->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DW (",4);
  pmVar2 = std::__detail::
           _Map_base<HWI::Pin,_std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<HWI::Pin>,_EnumHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<HWI::Pin,_std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<HWI::Pin>,_EnumHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&HWI::pinNames_abi_cxx11_,&local_34);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") = ",4);
  pmVar4 = std::__detail::
           _Map_base<HWI::PinState,_std::pair<const_HWI::PinState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_HWI::PinState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<HWI::PinState>,_EnumHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<HWI::PinState,_std::pair<const_HWI::PinState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_HWI::PinState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<HWI::PinState>,_EnumHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&HWI::pinStateNames_abi_cxx11_,&local_38);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(pmVar4->_M_dataplus)._M_p,pmVar4->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

void DigitalWrite( Pin pin, PinState state ) override
  {
    const std::string name = HWI::pinNames.at(pin);
    std::cout << "DW (" << HWI::pinNames.at(pin) 
              << ") = " << HWI::pinStateNames.at( state ) 
              << "\n";
  }